

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O3

void __thiscall embree::Camera::move(Camera *this,float dx,float dy,float dz)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  AffineSpace3fa xfm;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  camera2world((AffineSpace3fa *)&local_58.field_1,this);
  fVar4 = dx * local_58.m128[0] + dy * local_48 + dz * local_38;
  fVar5 = dx * local_58.m128[1] + dy * fStack_44 + dz * fStack_34;
  fVar6 = dx * local_58.m128[2] + dy * fStack_40 + dz * fStack_30;
  fVar7 = dx * local_58.m128[3] + dy * fStack_3c + dz * fStack_2c;
  fVar1 = (this->from).field_0.m128[1];
  fVar2 = (this->from).field_0.m128[2];
  fVar3 = (this->from).field_0.m128[3];
  (this->from).field_0.m128[0] = (this->from).field_0.m128[0] + fVar4;
  (this->from).field_0.m128[1] = fVar1 + fVar5;
  (this->from).field_0.m128[2] = fVar2 + fVar6;
  (this->from).field_0.m128[3] = fVar3 + fVar7;
  fVar1 = (this->to).field_0.m128[1];
  fVar2 = (this->to).field_0.m128[2];
  fVar3 = (this->to).field_0.m128[3];
  (this->to).field_0.m128[0] = fVar4 + (this->to).field_0.m128[0];
  (this->to).field_0.m128[1] = fVar5 + fVar1;
  (this->to).field_0.m128[2] = fVar6 + fVar2;
  (this->to).field_0.m128[3] = fVar7 + fVar3;
  return;
}

Assistant:

void move (float dx, float dy, float dz)
    {
      AffineSpace3fa xfm = camera2world();
      Vec3fa ds = xfmVector(xfm,Vec3fa(dx,dy,dz));
      from += ds;
      to   += ds;
    }